

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv2d.cpp
# Opt level: O2

void benchmark<float>(size_t num_channels,size_t num_outputs,size_t num_images)

{
  size_t image_size1;
  uint uVar1;
  uint uVar2;
  ostream *poVar3;
  long lVar4;
  size_t i;
  long lVar5;
  long lVar6;
  size_t filter_size;
  long lVar7;
  pointer pfVar8;
  long lVar9;
  size_t j;
  size_t sVar10;
  size_t sVar11;
  long lVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double dVar19;
  double dVar22;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  vector<float,_remora::cpu_tag> filter;
  matrix<float,_remora::row_major,_remora::cpu_tag> image;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"Flops");
  std::endl<char,std::char_traits<char>>(poVar3);
  for (filter_size = 4; filter_size != 0x20; filter_size = filter_size * 2) {
    lVar7 = num_outputs * num_channels * filter_size;
    lVar4 = filter_size * num_channels;
    auVar13._8_4_ = (int)((ulong)lVar4 >> 0x20);
    auVar13._0_8_ = lVar4;
    auVar13._12_4_ = 0x45300000;
    auVar14._8_4_ = (int)(filter_size >> 0x20);
    auVar14._0_8_ = filter_size;
    auVar14._12_4_ = 0x45300000;
    for (lVar6 = 0; lVar6 != 5; lVar6 = lVar6 + 1) {
      uVar1 = 0x20 << ((byte)lVar6 & 0x1f);
      uVar2 = uVar1 | 3;
      lVar12 = (long)(int)uVar2;
      image_size1 = (filter_size - 1) + lVar12;
      remora::matrix<float,_remora::row_major,_remora::cpu_tag>::matrix
                (&image,num_images,image_size1 * num_channels * image_size1);
      remora::vector<float,_remora::cpu_tag>::vector(&filter,lVar7 * filter_size);
      auVar15._8_4_ = (int)uVar2 >> 0x1f;
      auVar15._0_8_ = lVar12;
      auVar15._12_4_ = 0x45300000;
      dVar19 = (double)DAT_00106020;
      dVar22 = DAT_00106020._8_8_;
      lVar12 = lVar12 * num_channels;
      auVar16._8_4_ = (int)((ulong)lVar12 >> 0x20);
      auVar16._0_8_ = lVar12;
      auVar16._12_4_ = 0x45300000;
      lVar5 = 0;
      for (sVar11 = 0; sVar11 != num_images; sVar11 = sVar11 + 1) {
        pfVar8 = (pointer)(image.m_size2 * lVar5 +
                          (long)image.m_data.super__Vector_base<float,_std::allocator<float>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        for (lVar9 = 0; lVar9 != image_size1 * num_channels; lVar9 = lVar9 + 1) {
          auVar20._8_4_ = (int)((ulong)lVar9 >> 0x20);
          auVar20._0_8_ = lVar9;
          auVar20._12_4_ = 0x45300000;
          for (sVar10 = 0; image_size1 != sVar10; sVar10 = sVar10 + 1) {
            auVar21._8_4_ = (int)(sVar10 >> 0x20);
            auVar21._0_8_ = sVar10;
            auVar21._12_4_ = 0x45300000;
            pfVar8[sVar10] =
                 (float)(((auVar21._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)sVar10) - 4503599627370496.0)) *
                         (-0.1 / ((auVar15._8_8_ - dVar22) +
                                 ((double)(CONCAT44(0x43300000,uVar1) | 3) - dVar19))) +
                        ((auVar20._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0)) *
                        (1.0 / ((auVar16._8_8_ - dVar22) +
                               ((double)CONCAT44(0x43300000,(int)lVar12) - dVar19))) + 0.1);
          }
          pfVar8 = pfVar8 + image_size1;
        }
        lVar5 = lVar5 + 4;
      }
      lVar5 = 0;
      for (lVar12 = 0; lVar12 != lVar7; lVar12 = lVar12 + 1) {
        auVar17._8_4_ = (int)((ulong)lVar12 >> 0x20);
        auVar17._0_8_ = lVar12;
        auVar17._12_4_ = 0x45300000;
        for (sVar11 = 0; filter_size != sVar11; sVar11 = sVar11 + 1) {
          auVar18._8_4_ = (int)(sVar11 >> 0x20);
          auVar18._0_8_ = sVar11;
          auVar18._12_4_ = 0x45300000;
          *(float *)((long)filter.m_storage.super__Vector_base<float,_std::allocator<float>_>.
                           _M_impl.super__Vector_impl_data._M_start + sVar11 * 4 + lVar5) =
               (float)(((auVar18._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)sVar11) - 4503599627370496.0)) *
                       (-0.1 / ((auVar14._8_8_ - 1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,(int)filter_size) - 4503599627370496.0))
                       ) + ((auVar17._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)lVar12) - 4503599627370496.0)) *
                           (1.0 / ((auVar13._8_8_ - 1.9342813113834067e+25) +
                                  ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0))) +
                           0.1);
        }
        lVar5 = lVar5 + filter_size * 4;
      }
      benchmark<remora::matrix<float,remora::row_major,remora::cpu_tag>,remora::vector<float,remora::cpu_tag>>
                ((matrix_expression<remora::matrix<float,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                  *)&image,
                 (vector_expression<remora::vector<float,_remora::cpu_tag>,_remora::cpu_tag> *)
                 &filter,num_channels,num_outputs,image_size1,image_size1,filter_size);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                ((_Vector_base<float,_std::allocator<float>_> *)&filter);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&image.m_data.super__Vector_base<float,_std::allocator<float>_>);
    }
  }
  return;
}

Assistant:

void benchmark(std::size_t num_channels, std::size_t num_outputs, std::size_t num_images){
	std::cout<<"Flops"<<std::endl;
	for(std::size_t filterSize = 4; filterSize != 32; filterSize *= 2){
		for(std::size_t iter = 0; iter != 5; ++iter){
			std::size_t sizeOut1 = 3+16 * (2<<iter);
			std::size_t sizeOut2 = 3+16 * (2<<iter);
			std::size_t sizeIm1 = sizeOut1 + filterSize-1;
			std::size_t sizeIm2 = sizeOut2 + filterSize-1;

			remora::matrix<T> image(num_images, num_channels * sizeIm1 * sizeIm2);
			remora::vector<T> filter(num_channels * num_outputs *  filterSize * filterSize);
			
			for(std::size_t im = 0; im != num_images; ++im){
				for(std::size_t i = 0; i != num_channels * sizeIm1; ++i){
					for(std::size_t j = 0; j != sizeIm2; ++j){
						image(im, i * sizeIm2 + j)  = 1.0/(num_channels * sizeOut1)*i + 0.1 - (0.1/sizeOut2)*j;
					}
				}
			}
			for(std::size_t i = 0; i != num_channels * num_outputs * filterSize; ++i){
				for(std::size_t j = 0; j != filterSize; ++j){
					filter(i * filterSize + j)  = 1.0/(num_channels * filterSize)*i + 0.1 - (0.1/filterSize)*j;
				}
			}

			benchmark(image,filter,num_channels,num_outputs, sizeIm1, sizeIm2, filterSize);
		}
	}
}